

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
helics::make_cloning_filter(FilterTypes type,CoreApp *core,string_view delivery,string_view name)

{
  size_t sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
  _Var2;
  string_view delivery_00;
  
  _Var2.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
  _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var2.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
  _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl._0_4_ = type;
  delivery_00._M_str = delivery._M_str;
  sVar1 = *(size_t *)delivery._M_len;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((size_t *)delivery._M_len)[1];
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  delivery_00._M_len = sVar1;
  make_cloning_filter(type,(Core *)core,delivery_00,name);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return (__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
          )(tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>)
           _Var2.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CloningFilter> make_cloning_filter(FilterTypes type,
                                                   CoreApp& core,
                                                   std::string_view delivery,
                                                   std::string_view name)

{
    return make_cloning_filter(type, core.getCopyofCorePointer().get(), delivery, name);
}